

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateRange(Cba_Ntk_t *p,int iFon,int NameId)

{
  Cba_Man_t *pCVar1;
  int iVar2;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int f;
  
  pCVar1 = p->pDesign;
  iVar2 = NameId + 1;
  Vec_IntFillExtra(&pCVar1->vNameMap,iVar2,NameId);
  if ((-1 < NameId) && (NameId < (pCVar1->vNameMap).nSize)) {
    f = (pCVar1->vNameMap).pArray[(uint)NameId];
    if (0 < f) {
LAB_00342abf:
      iVar2 = Cba_FonRangeSize(p,f);
      return iVar2;
    }
    pCVar1 = p->pDesign;
    Vec_IntFillExtra(&pCVar1->vNameMap,iVar2,Fill);
    if (NameId < (pCVar1->vNameMap).nSize) {
      (pCVar1->vNameMap).pArray[(uint)NameId] = 0;
      pCVar1 = p->pDesign;
      Vec_IntFillExtra(&pCVar1->vNameMap,iVar2,Fill_00);
      if ((pCVar1->vNameMap).nSize <= NameId) goto LAB_00342aeb;
      if ((pCVar1->vNameMap).pArray[(uint)NameId] != 0) {
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x37b,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar1->vNameMap,iVar2,Fill_01);
      if (NameId < (pCVar1->vNameMap).nSize) {
        (pCVar1->vNameMap).pArray[(uint)NameId] = iFon;
        Vec_IntPush(&pCVar1->vUsed,NameId);
        if (f == 0) {
          return 1;
        }
        if ((p->vFonRange).nSize < 1) {
          __assert_fail("Cba_NtkHasFonRanges(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x185,"void Cba_FonSetRangeSign(Cba_Ntk_t *, int, int)");
        }
        Vec_IntFillExtra(&p->vFonRange,iFon + 1,Fill_02);
        if ((-1 < iFon) && (iFon < (p->vFonRange).nSize)) {
          (p->vFonRange).pArray[(uint)iFon] = -f;
          f = iFon;
          goto LAB_00342abf;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_00342aeb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateRange( Cba_Ntk_t * p, int iFon, int NameId )
{
    int RangeId = -Cba_NtkGetMap(p, NameId);
    if ( RangeId < 0 ) // this variable is already created
        return Cba_FonRangeSize( p, -RangeId );
    Cba_NtkUnsetMap( p, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    if ( RangeId == 0 )
        return 1;
    assert( RangeId > 0 );
    Cba_FonSetRangeSign( p, iFon, RangeId );
    return Cba_FonRangeSize( p, iFon );
}